

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar59;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  float fVar72;
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  undefined1 auVar80 [32];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  auVar4 = *(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8);
  lVar51 = (uVar5 + 1) * sVar8;
  auVar62 = *(undefined1 (*) [16])(pcVar7 + lVar51);
  lVar52 = (uVar5 + 2) * sVar8;
  auVar61 = *(undefined1 (*) [16])(pcVar7 + lVar52);
  auVar71 = ZEXT1664(auVar61);
  lVar53 = (uVar5 + 3) * sVar8;
  auVar55 = *(undefined1 (*) [16])(pcVar7 + lVar53);
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar13 = fVar3 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  fVar14 = fVar3 * *(float *)(pcVar7 + lVar51 + 0xc);
  fVar15 = fVar3 * *(float *)(pcVar7 + lVar52 + 0xc);
  fVar75 = 0.0;
  fVar3 = fVar3 * *(float *)(pcVar7 + lVar53 + 0xc);
  uVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  lVar51 = (long)(int)uVar5;
  auVar73 = ZEXT416((uint)fVar15);
  if (lVar51 == 4) {
    auVar17 = vshufps_avx(auVar55,auVar55,0);
    auVar67 = vshufps_avx(auVar55,auVar55,0x55);
    auVar60 = vshufps_avx(auVar55,auVar55,0xaa);
    auVar18 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    auVar54 = vshufps_avx(auVar61,auVar61,0);
    auVar19 = vshufps_avx(auVar61,auVar61,0x55);
    auVar55 = vinsertps_avx(auVar61,ZEXT416((uint)fVar15),0x30);
    auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar20 = vshufps_avx(ZEXT416((uint)fVar15),auVar73,0);
    auVar73 = vshufps_avx(auVar62,auVar62,0);
    auVar21 = vshufps_avx(auVar62,auVar62,0x55);
    auVar62 = vshufps_avx(auVar62,auVar62,0xaa);
    auVar76 = vshufps_avx(auVar4,auVar4,0);
    auVar22 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
    auVar23 = vshufps_avx(auVar4,auVar4,0x55);
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar24 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
    auVar74._0_4_ =
         auVar73._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar17._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar54._0_4_ +
         (float)catmullrom_basis0._272_4_ * auVar76._0_4_;
    auVar74._4_4_ =
         auVar73._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar17._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar54._4_4_ +
         (float)catmullrom_basis0._276_4_ * auVar76._4_4_;
    auVar74._8_4_ =
         auVar73._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar17._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar54._8_4_ +
         (float)catmullrom_basis0._280_4_ * auVar76._8_4_;
    auVar74._12_4_ =
         auVar73._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar17._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar54._12_4_ +
         (float)catmullrom_basis0._284_4_ * auVar76._12_4_;
    auVar76._0_4_ =
         auVar21._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar67._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar19._0_4_ +
         auVar23._0_4_ * (float)catmullrom_basis0._272_4_;
    auVar76._4_4_ =
         auVar21._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar67._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar19._4_4_ +
         auVar23._4_4_ * (float)catmullrom_basis0._276_4_;
    auVar76._8_4_ =
         auVar21._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar67._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar19._8_4_ +
         auVar23._8_4_ * (float)catmullrom_basis0._280_4_;
    auVar76._12_4_ =
         auVar21._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar67._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar19._12_4_ +
         auVar23._12_4_ * (float)catmullrom_basis0._284_4_;
    auVar54._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar4._0_4_ +
         (float)catmullrom_basis0._1428_4_ * auVar62._0_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar61._0_4_ +
         auVar60._0_4_ * (float)catmullrom_basis0._3740_4_;
    auVar54._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar4._4_4_ +
         (float)catmullrom_basis0._1432_4_ * auVar62._4_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar61._4_4_ +
         auVar60._4_4_ * (float)catmullrom_basis0._3744_4_;
    auVar54._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar4._8_4_ +
         (float)catmullrom_basis0._1436_4_ * auVar62._8_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar61._8_4_ +
         auVar60._8_4_ * (float)catmullrom_basis0._3748_4_;
    auVar54._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar4._12_4_ +
         (float)catmullrom_basis0._1440_4_ * auVar62._12_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar61._12_4_ +
         auVar60._12_4_ * (float)catmullrom_basis0._3752_4_;
    auVar60._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar24._0_4_ +
         (float)catmullrom_basis0._1428_4_ * auVar22._0_4_ +
         auVar18._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar20._0_4_;
    auVar60._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar24._4_4_ +
         (float)catmullrom_basis0._1432_4_ * auVar22._4_4_ +
         auVar18._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar20._4_4_;
    auVar60._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar24._8_4_ +
         (float)catmullrom_basis0._1436_4_ * auVar22._8_4_ +
         auVar18._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar20._8_4_;
    auVar60._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar24._12_4_ +
         (float)catmullrom_basis0._1440_4_ * auVar22._12_4_ +
         auVar18._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar20._12_4_;
    auVar73 = vshufps_avx(auVar74,auVar74,0xb1);
    auVar4 = vminps_avx(auVar73,auVar74);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar17 = vshufps_avx(auVar76,auVar76,0xb1);
    auVar62 = vminps_avx(auVar17,auVar76);
    auVar61 = vshufpd_avx(auVar62,auVar62,1);
    auVar62 = vminps_avx(auVar61,auVar62);
    auVar4 = vinsertps_avx(auVar4,auVar62,0x1c);
    auVar67 = vshufps_avx(auVar54,auVar54,0xb1);
    auVar62 = vminps_avx(auVar67,auVar54);
    auVar61 = vshufpd_avx(auVar62,auVar62,1);
    auVar62 = vminps_avx(auVar61,auVar62);
    auVar62 = vinsertps_avx(auVar4,auVar62,0x20);
    auVar4 = vmaxps_avx(auVar73,auVar74);
    auVar61 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vmaxps_avx(auVar61,auVar4);
    auVar61 = vmaxps_avx(auVar17,auVar76);
    auVar73 = vshufpd_avx(auVar61,auVar61,1);
    auVar61 = vmaxps_avx(auVar73,auVar61);
    auVar4 = vinsertps_avx(auVar4,auVar61,0x1c);
    auVar61 = vmaxps_avx(auVar67,auVar54);
    auVar73 = vshufpd_avx(auVar61,auVar61,1);
    auVar61 = vmaxps_avx(auVar73,auVar61);
    auVar61 = vinsertps_avx(auVar4,auVar61,0x20);
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx(auVar60,auVar67);
    auVar73 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar73,auVar4);
    auVar73 = vshufps_avx(auVar4,auVar4,0);
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar73 = vmaxps_avx(auVar4,auVar73);
    auVar17 = vminps_avx(auVar62,auVar55);
    auVar62 = vmaxps_avx(auVar61,auVar55);
    auVar4 = vandps_avx(auVar20,auVar67);
    auVar61 = vmaxps_avx(auVar73,auVar4);
    auVar4 = vsubps_avx(auVar17,auVar61);
  }
  else {
    auVar17 = vpshufd_avx(ZEXT416(uVar5),0);
    auVar67 = vshufps_avx(auVar4,auVar4,0);
    auVar60 = vshufps_avx(auVar4,auVar4,0x55);
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    auVar18 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
    auVar54 = vshufps_avx(auVar62,auVar62,0);
    auVar19 = vshufps_avx(auVar62,auVar62,0x55);
    auVar62 = vshufps_avx(auVar62,auVar62,0xaa);
    auVar20 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
    auVar21 = vshufps_avx(auVar61,auVar61,0);
    auVar76 = vshufps_avx(auVar61,auVar61,0x55);
    auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar22 = vshufps_avx(auVar55,auVar55,0);
    auVar65 = ZEXT1664(auVar22);
    auVar23 = vshufps_avx(auVar55,auVar55,0x55);
    auVar55 = vshufps_avx(auVar55,auVar55,0xaa);
    auVar56._16_16_ = auVar55;
    auVar56._0_16_ = auVar55;
    auVar24 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    lVar52 = lVar51 * 0x44;
    auVar77._8_4_ = 0x7f800000;
    auVar77._0_8_ = 0x7f8000007f800000;
    auVar77._12_4_ = 0x7f800000;
    auVar77._16_4_ = 0x7f800000;
    auVar77._20_4_ = 0x7f800000;
    auVar77._24_4_ = 0x7f800000;
    auVar77._28_4_ = 0x7f800000;
    auVar80._8_4_ = 0xff800000;
    auVar80._0_8_ = 0xff800000ff800000;
    auVar80._12_4_ = 0xff800000;
    auVar80._16_4_ = 0xff800000;
    auVar80._20_4_ = 0xff800000;
    auVar80._24_4_ = 0xff800000;
    auVar80._28_4_ = 0xff800000;
    auVar69 = ZEXT864(0) << 0x20;
    auVar9 = auVar77;
    auVar10 = auVar77;
    auVar11 = auVar80;
    auVar12 = auVar80;
    for (lVar53 = 0; auVar68 = auVar69._0_32_, lVar53 <= lVar51; lVar53 = lVar53 + 8) {
      auVar16 = vpshufd_avx(ZEXT416((uint)lVar53),0);
      auVar74 = vpor_avx(auVar16,_DAT_01f4ad30);
      auVar16 = vpor_avx(auVar16,_DAT_01f7afa0);
      auVar74 = vpcmpgtd_avx(auVar74,auVar17);
      auVar16 = vpcmpgtd_avx(auVar16,auVar17);
      auVar78._16_16_ = auVar16;
      auVar78._0_16_ = auVar74;
      pfVar1 = (float *)(lVar52 + 0x2204c74 + lVar53 * 4);
      fVar3 = *pfVar1;
      fVar13 = pfVar1[1];
      fVar14 = pfVar1[2];
      fVar15 = pfVar1[3];
      fVar26 = pfVar1[4];
      fVar27 = pfVar1[5];
      fVar28 = pfVar1[6];
      pfVar2 = (float *)(lVar52 + 0x22050f8 + lVar53 * 4);
      fVar29 = *pfVar2;
      fVar30 = pfVar2[1];
      fVar31 = pfVar2[2];
      fVar32 = pfVar2[3];
      fVar33 = pfVar2[4];
      fVar34 = pfVar2[5];
      fVar35 = pfVar2[6];
      fVar36 = pfVar2[7];
      local_1a8 = auVar22._0_4_;
      fStack_1a4 = auVar22._4_4_;
      fStack_1a0 = auVar22._8_4_;
      fStack_19c = auVar22._12_4_;
      local_1c8 = auVar23._0_4_;
      fStack_1c4 = auVar23._4_4_;
      fStack_1c0 = auVar23._8_4_;
      fStack_1bc = auVar23._12_4_;
      local_1e8 = auVar55._0_4_;
      fStack_1e4 = auVar55._4_4_;
      fStack_1e0 = auVar55._8_4_;
      fStack_1dc = auVar55._12_4_;
      local_128 = auVar21._0_4_;
      fStack_124 = auVar21._4_4_;
      fStack_120 = auVar21._8_4_;
      fStack_11c = auVar21._12_4_;
      fVar59 = fVar75 + auVar56._28_4_;
      local_148 = auVar76._0_4_;
      fStack_144 = auVar76._4_4_;
      fStack_140 = auVar76._8_4_;
      fStack_13c = auVar76._12_4_;
      fVar66 = fVar75 + auVar65._28_4_;
      local_168 = auVar61._0_4_;
      fStack_164 = auVar61._4_4_;
      fStack_160 = auVar61._8_4_;
      fStack_15c = auVar61._12_4_;
      fVar72 = fVar75 + auVar71._28_4_;
      pfVar2 = (float *)(lVar52 + 0x22047f0 + lVar53 * 4);
      fVar37 = *pfVar2;
      fVar38 = pfVar2[1];
      fVar39 = pfVar2[2];
      fVar40 = pfVar2[3];
      fVar41 = pfVar2[4];
      fVar42 = pfVar2[5];
      fVar43 = pfVar2[6];
      local_188 = auVar73._0_4_;
      fStack_184 = auVar73._4_4_;
      fStack_180 = auVar73._8_4_;
      fStack_17c = auVar73._12_4_;
      fVar79 = pfVar1[7] + fVar36;
      local_a8 = auVar54._0_4_;
      fStack_a4 = auVar54._4_4_;
      fStack_a0 = auVar54._8_4_;
      fStack_9c = auVar54._12_4_;
      local_c8 = auVar19._0_4_;
      fStack_c4 = auVar19._4_4_;
      fStack_c0 = auVar19._8_4_;
      fStack_bc = auVar19._12_4_;
      local_e8 = auVar62._0_4_;
      fStack_e4 = auVar62._4_4_;
      fStack_e0 = auVar62._8_4_;
      fStack_dc = auVar62._12_4_;
      pfVar1 = (float *)(catmullrom_basis0 + lVar53 * 4 + lVar52);
      fVar44 = *pfVar1;
      fVar45 = pfVar1[1];
      fVar46 = pfVar1[2];
      fVar47 = pfVar1[3];
      fVar48 = pfVar1[4];
      fVar49 = pfVar1[5];
      fVar50 = pfVar1[6];
      local_108 = auVar20._0_4_;
      fStack_104 = auVar20._4_4_;
      fStack_100 = auVar20._8_4_;
      fStack_fc = auVar20._12_4_;
      fVar75 = fVar79 + pfVar2[7];
      local_28 = auVar67._0_4_;
      fStack_24 = auVar67._4_4_;
      fStack_20 = auVar67._8_4_;
      fStack_1c = auVar67._12_4_;
      auVar57._0_4_ = fVar44 * local_28 + fVar37 * local_a8 + fVar3 * local_128 + fVar29 * local_1a8
      ;
      auVar57._4_4_ =
           fVar45 * fStack_24 + fVar38 * fStack_a4 + fVar13 * fStack_124 + fVar30 * fStack_1a4;
      auVar57._8_4_ =
           fVar46 * fStack_20 + fVar39 * fStack_a0 + fVar14 * fStack_120 + fVar31 * fStack_1a0;
      auVar57._12_4_ =
           fVar47 * fStack_1c + fVar40 * fStack_9c + fVar15 * fStack_11c + fVar32 * fStack_19c;
      auVar57._16_4_ =
           fVar48 * local_28 + fVar41 * local_a8 + fVar26 * local_128 + fVar33 * local_1a8;
      auVar57._20_4_ =
           fVar49 * fStack_24 + fVar42 * fStack_a4 + fVar27 * fStack_124 + fVar34 * fStack_1a4;
      auVar57._24_4_ =
           fVar50 * fStack_20 + fVar43 * fStack_a0 + fVar28 * fStack_120 + fVar35 * fStack_1a0;
      auVar57._28_4_ = fVar79 + fVar36 + fVar59;
      local_48 = auVar60._0_4_;
      fStack_44 = auVar60._4_4_;
      fStack_40 = auVar60._8_4_;
      fStack_3c = auVar60._12_4_;
      auVar63._0_4_ = fVar44 * local_48 + fVar37 * local_c8 + fVar3 * local_148 + fVar29 * local_1c8
      ;
      auVar63._4_4_ =
           fVar45 * fStack_44 + fVar38 * fStack_c4 + fVar13 * fStack_144 + fVar30 * fStack_1c4;
      auVar63._8_4_ =
           fVar46 * fStack_40 + fVar39 * fStack_c0 + fVar14 * fStack_140 + fVar31 * fStack_1c0;
      auVar63._12_4_ =
           fVar47 * fStack_3c + fVar40 * fStack_bc + fVar15 * fStack_13c + fVar32 * fStack_1bc;
      auVar63._16_4_ =
           fVar48 * local_48 + fVar41 * local_c8 + fVar26 * local_148 + fVar33 * local_1c8;
      auVar63._20_4_ =
           fVar49 * fStack_44 + fVar42 * fStack_c4 + fVar27 * fStack_144 + fVar34 * fStack_1c4;
      auVar63._24_4_ =
           fVar50 * fStack_40 + fVar43 * fStack_c0 + fVar28 * fStack_140 + fVar35 * fStack_1c0;
      auVar63._28_4_ = fVar79 + fVar36 + fVar66;
      auVar56 = vminps_avx(auVar9,auVar57);
      auVar9 = vblendvps_avx(auVar56,auVar9,auVar78);
      auVar56 = vminps_avx(auVar77,auVar63);
      auVar77 = vblendvps_avx(auVar56,auVar77,auVar78);
      local_68 = auVar4._0_4_;
      fStack_64 = auVar4._4_4_;
      fStack_60 = auVar4._8_4_;
      fStack_5c = auVar4._12_4_;
      auVar70._0_4_ = fVar44 * local_68 + fVar37 * local_e8 + fVar3 * local_168 + fVar29 * local_1e8
      ;
      auVar70._4_4_ =
           fVar45 * fStack_64 + fVar38 * fStack_e4 + fVar13 * fStack_164 + fVar30 * fStack_1e4;
      auVar70._8_4_ =
           fVar46 * fStack_60 + fVar39 * fStack_e0 + fVar14 * fStack_160 + fVar31 * fStack_1e0;
      auVar70._12_4_ =
           fVar47 * fStack_5c + fVar40 * fStack_dc + fVar15 * fStack_15c + fVar32 * fStack_1dc;
      auVar70._16_4_ =
           fVar48 * local_68 + fVar41 * local_e8 + fVar26 * local_168 + fVar33 * local_1e8;
      auVar70._20_4_ =
           fVar49 * fStack_64 + fVar42 * fStack_e4 + fVar27 * fStack_164 + fVar34 * fStack_1e4;
      auVar70._24_4_ =
           fVar50 * fStack_60 + fVar43 * fStack_e0 + fVar28 * fStack_160 + fVar35 * fStack_1e0;
      auVar70._28_4_ = auVar56._28_4_ + fVar36 + fVar72;
      auVar71 = ZEXT3264(auVar70);
      auVar56 = vminps_avx(auVar10,auVar70);
      auVar10 = vblendvps_avx(auVar56,auVar10,auVar78);
      auVar56 = vmaxps_avx(auVar11,auVar57);
      auVar11 = vblendvps_avx(auVar56,auVar11,auVar78);
      local_88 = auVar18._0_4_;
      fStack_84 = auVar18._4_4_;
      fStack_80 = auVar18._8_4_;
      fStack_7c = auVar18._12_4_;
      auVar58._0_4_ =
           fVar44 * local_88 + fVar3 * local_188 + fVar29 * auVar24._0_4_ + fVar37 * local_108;
      auVar58._4_4_ =
           fVar45 * fStack_84 + fVar13 * fStack_184 + fVar30 * auVar24._4_4_ + fVar38 * fStack_104;
      auVar58._8_4_ =
           fVar46 * fStack_80 + fVar14 * fStack_180 + fVar31 * auVar24._8_4_ + fVar39 * fStack_100;
      auVar58._12_4_ =
           fVar47 * fStack_7c + fVar15 * fStack_17c + fVar32 * auVar24._12_4_ + fVar40 * fStack_fc;
      auVar58._16_4_ =
           fVar48 * local_88 + fVar26 * local_188 + fVar33 * auVar24._0_4_ + fVar41 * local_108;
      auVar58._20_4_ =
           fVar49 * fStack_84 + fVar27 * fStack_184 + fVar34 * auVar24._4_4_ + fVar42 * fStack_104;
      auVar58._24_4_ =
           fVar50 * fStack_80 + fVar28 * fStack_180 + fVar35 * auVar24._8_4_ + fVar43 * fStack_100;
      auVar58._28_4_ = auVar56._28_4_ + fVar75;
      auVar56 = vmaxps_avx(auVar12,auVar63);
      auVar12 = vblendvps_avx(auVar56,auVar12,auVar78);
      auVar56 = vmaxps_avx(auVar80,auVar70);
      auVar80 = vblendvps_avx(auVar56,auVar80,auVar78);
      auVar64._8_4_ = 0x7fffffff;
      auVar64._0_8_ = 0x7fffffff7fffffff;
      auVar64._12_4_ = 0x7fffffff;
      auVar64._16_4_ = 0x7fffffff;
      auVar64._20_4_ = 0x7fffffff;
      auVar64._24_4_ = 0x7fffffff;
      auVar64._28_4_ = 0x7fffffff;
      auVar65 = ZEXT3264(auVar64);
      auVar56 = vandps_avx(auVar58,auVar64);
      auVar56 = vmaxps_avx(auVar68,auVar56);
      auVar68 = vblendvps_avx(auVar56,auVar68,auVar78);
      auVar69 = ZEXT3264(auVar68);
    }
    auVar56 = vshufps_avx(auVar9,auVar9,0xb1);
    auVar9 = vminps_avx(auVar9,auVar56);
    auVar56 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar56);
    auVar4 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar77,auVar77,0xb1);
    auVar9 = vminps_avx(auVar77,auVar9);
    auVar77 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar77);
    auVar62 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar62 = vunpcklps_avx(auVar4,auVar62);
    auVar9 = vshufps_avx(auVar10,auVar10,0xb1);
    auVar9 = vminps_avx(auVar10,auVar9);
    auVar77 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar77);
    auVar4 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar4 = vinsertps_avx(auVar62,auVar4,0x28);
    auVar9 = vshufps_avx(auVar11,auVar11,0xb1);
    auVar9 = vmaxps_avx(auVar11,auVar9);
    auVar77 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar77);
    auVar62 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar12,auVar12,0xb1);
    auVar9 = vmaxps_avx(auVar12,auVar9);
    auVar77 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar77);
    auVar61 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar61 = vunpcklps_avx(auVar62,auVar61);
    auVar9 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar9 = vmaxps_avx(auVar80,auVar9);
    auVar77 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar77);
    auVar62 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar62 = vinsertps_avx(auVar61,auVar62,0x28);
    auVar9 = vshufps_avx(auVar68,auVar68,0xb1);
    auVar9 = vmaxps_avx(auVar68,auVar9);
    auVar77 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar77);
    auVar61 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar61 = vshufps_avx(auVar61,auVar61,0);
    auVar4 = vsubps_avx(auVar4,auVar61);
  }
  auVar55._0_4_ = auVar62._0_4_ + auVar61._0_4_;
  auVar55._4_4_ = auVar62._4_4_ + auVar61._4_4_;
  auVar55._8_4_ = auVar62._8_4_ + auVar61._8_4_;
  auVar55._12_4_ = auVar62._12_4_ + auVar61._12_4_;
  auVar61._8_4_ = 0x7fffffff;
  auVar61._0_8_ = 0x7fffffff7fffffff;
  auVar61._12_4_ = 0x7fffffff;
  auVar62 = vandps_avx(auVar4,auVar61);
  auVar61 = vandps_avx(auVar55,auVar61);
  auVar62 = vmaxps_avx(auVar62,auVar61);
  auVar61 = vmovshdup_avx(auVar62);
  auVar61 = vmaxss_avx(auVar61,auVar62);
  auVar62 = vshufpd_avx(auVar62,auVar62,1);
  auVar62 = vmaxss_avx(auVar62,auVar61);
  auVar62 = ZEXT416((uint)(auVar62._0_4_ * 4.7683716e-07));
  auVar62 = vshufps_avx(auVar62,auVar62,0);
  aVar25 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar4,auVar62);
  (__return_storage_ptr__->lower).field_0 = aVar25;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar55._0_4_ + auVar62._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar55._4_4_ + auVar62._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar55._8_4_ + auVar62._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar55._12_4_ + auVar62._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }